

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeLiteGenerator::CreateProjectFile
          (cmExtraCodeLiteGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  string *__lhs;
  string filename;
  string projectName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  __lhs = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                    (*(lgs->
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                      _M_impl.super__Vector_impl_data._M_start);
  cmLocalGenerator::GetProjectName_abi_cxx11_
            (&local_38,
             *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start);
  std::operator+(&bStack_78,__lhs,"/");
  std::operator+(&local_58,&local_38,".project");
  std::__cxx11::string::append((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  CreateNewProjectFile(this,lgs,&bStack_78);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateProjectFile(
  const std::vector<cmLocalGenerator*>& lgs)
{
  std::string const& outputDir = lgs[0]->GetCurrentBinaryDirectory();
  std::string projectName = lgs[0]->GetProjectName();
  std::string filename = outputDir + "/";

  filename += projectName + ".project";
  this->CreateNewProjectFile(lgs, filename);
}